

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofConstraint::buildLinearJacobian
          (btGeneric6DofConstraint *this,btJacobianEntry *jacLinear,btVector3 *normalWorld,
          btVector3 *pivotAInW,btVector3 *pivotBInW)

{
  btTransform *pbVar1;
  btJacobianEntry *in_RCX;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  btMatrix3x3 *in_R8;
  btVector3 *in_stack_ffffffffffffff20;
  btMatrix3x3 *local_98;
  btScalar in_stack_ffffffffffffffb0;
  btScalar in_stack_ffffffffffffffb4;
  btVector3 *in_stack_ffffffffffffffb8;
  btVector3 *in_stack_ffffffffffffffc0;
  btVector3 *in_stack_ffffffffffffffc8;
  btMatrix3x3 *in_stack_ffffffffffffffd0;
  btMatrix3x3 *world2A;
  btJacobianEntry *this_00;
  btVector3 *inertiaInvB;
  
  inertiaInvB = in_RDI;
  pbVar1 = btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI[2].m_floats + 2));
  btTransform::getBasis(pbVar1);
  btMatrix3x3::transpose(local_98);
  pbVar1 = btRigidBody::getCenterOfMassTransform(*(btRigidBody **)in_RDI[3].m_floats);
  btTransform::getBasis(pbVar1);
  btMatrix3x3::transpose(local_98);
  this_00 = in_RCX;
  btRigidBody::getCenterOfMassPosition((btRigidBody *)0x201a28);
  operator-(in_stack_ffffffffffffff20,&in_RCX->m_linearJointAxis);
  world2A = in_R8;
  btRigidBody::getCenterOfMassPosition((btRigidBody *)0x201a5c);
  operator-(in_R8->m_el,&in_RCX->m_linearJointAxis);
  btRigidBody::getInvInertiaDiagLocal(*(btRigidBody **)(in_RDI[2].m_floats + 2));
  btRigidBody::getInvMass(*(btRigidBody **)(in_RDI[2].m_floats + 2));
  btRigidBody::getInvInertiaDiagLocal(*(btRigidBody **)in_RDI[3].m_floats);
  btRigidBody::getInvMass(*(btRigidBody **)in_RDI[3].m_floats);
  btJacobianEntry::btJacobianEntry
            (this_00,world2A,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RSI,in_stack_ffffffffffffffb4,
             inertiaInvB,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void btGeneric6DofConstraint::buildLinearJacobian(
	btJacobianEntry & jacLinear,const btVector3 & normalWorld,
	const btVector3 & pivotAInW,const btVector3 & pivotBInW)
{
	new (&jacLinear) btJacobianEntry(
        m_rbA.getCenterOfMassTransform().getBasis().transpose(),
        m_rbB.getCenterOfMassTransform().getBasis().transpose(),
        pivotAInW - m_rbA.getCenterOfMassPosition(),
        pivotBInW - m_rbB.getCenterOfMassPosition(),
        normalWorld,
        m_rbA.getInvInertiaDiagLocal(),
        m_rbA.getInvMass(),
        m_rbB.getInvInertiaDiagLocal(),
        m_rbB.getInvMass());
}